

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint ON_SubDMeshFragment::QuadGridPointCountFromSideCount(uint side_segment_count)

{
  uint uVar1;
  
  uVar1 = SidePointCountFromSideCount(side_segment_count);
  return uVar1 * uVar1;
}

Assistant:

unsigned int ON_SubDMeshFragment::QuadGridPointCountFromSideCount(
  unsigned int side_segment_count
  )
{
  unsigned int side_point_count = ON_SubDMeshFragment::SidePointCountFromSideCount(side_segment_count);
  return side_point_count*side_point_count;
}